

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O2

StringPiece * __thiscall re2::StringGenerator::Next(StringGenerator *this)

{
  bool bVar1;
  pointer pcVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  LogMessageFatal LStack_198;
  
  if (this->hasnext_ == false) {
    LogMessageFatal::LogMessageFatal
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/string_generator.cc"
               ,0x50);
    std::operator<<((ostream *)&LStack_198.super_LogMessage.str_,"Check failed: hasnext_");
    LogMessageFatal::~LogMessageFatal(&LStack_198);
  }
  if (this->generate_null_ == true) {
    this->generate_null_ = false;
    pcVar2 = (pointer)0x0;
    iVar3 = 0;
  }
  else {
    (this->s_)._M_string_length = 0;
    *(this->s_)._M_dataplus._M_p = '\0';
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
      std::__cxx11::string::append((string *)&this->s_);
    }
    if (this->random_ == false) {
      bVar1 = IncrementDigits(this);
    }
    else {
      bVar1 = RandomDigits(this);
    }
    this->hasnext_ = bVar1;
    pcVar2 = (this->s_)._M_dataplus._M_p;
    iVar3 = (int)(this->s_)._M_string_length;
  }
  (this->sp_).ptr_ = pcVar2;
  (this->sp_).length_ = iVar3;
  return &this->sp_;
}

Assistant:

const StringPiece& StringGenerator::Next() {
  CHECK(hasnext_);
  if (generate_null_) {
    generate_null_ = false;
    sp_ = NULL;
    return sp_;
  }
  s_.clear();
  for (size_t i = 0; i < digits_.size(); i++) {
    s_ += alphabet_[digits_[i]];
  }
  hasnext_ = random_ ? RandomDigits() : IncrementDigits();
  sp_ = s_;
  return sp_;
}